

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

int mbedtls_ssl_parse_change_cipher_spec(mbedtls_ssl_context *ssl)

{
  uint16_t *puVar1;
  uchar *puVar2;
  int ret;
  uchar *puVar3;
  ulong uVar4;
  bool bVar5;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x141a,"=> parse change cipher spec");
  ret = mbedtls_ssl_read_record(ssl,1);
  if (ret == 0) {
    if (ssl->in_msgtype == 0x14) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x142f,"switching to new transform spec for inbound data");
      ssl->transform_in = ssl->transform_negotiate;
      ssl->session_in = ssl->session_negotiate;
      if (ssl->conf->transport == '\x01') {
        ssl->in_window_top = 0;
        ssl->in_window = 0;
        puVar1 = &ssl->in_epoch;
        *puVar1 = *puVar1 + 1;
        if (*puVar1 == 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x143d,"DTLS epoch would wrap");
          return -0x6b80;
        }
      }
      else {
        puVar2 = ssl->in_ctr;
        puVar2[0] = '\0';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
      }
      puVar2 = ssl->in_hdr;
      bVar5 = ssl->conf->transport == '\x01';
      uVar4 = (ulong)bVar5;
      puVar3 = puVar2 + -8;
      if (bVar5) {
        puVar3 = puVar2 + 3;
      }
      ssl->in_ctr = puVar3;
      ssl->in_len = puVar2 + uVar4 * 8 + 3;
      ssl->in_iv = puVar2 + uVar4 * 8 + 5;
      ssl->in_msg = puVar2 + uVar4 * 8 + 5;
      ssl->state = ssl->state + 1;
      ret = 0;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x144a,"<= parse change cipher spec");
    }
    else {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1422,"bad change cipher spec message");
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      ret = -0x7700;
    }
  }
  else {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x141d,"mbedtls_ssl_read_record",ret);
  }
  return ret;
}

Assistant:

int mbedtls_ssl_parse_change_cipher_spec(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> parse change cipher spec"));

    if ((ret = mbedtls_ssl_read_record(ssl, 1)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_read_record", ret);
        return ret;
    }

    if (ssl->in_msgtype != MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad change cipher spec message"));
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE);
        return MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE;
    }

    /* CCS records are only accepted if they have length 1 and content '1',
     * so we don't need to check this here. */

    /*
     * Switch to our negotiated transform and session parameters for inbound
     * data.
     */
    MBEDTLS_SSL_DEBUG_MSG(3, ("switching to new transform spec for inbound data"));
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    ssl->transform_in = ssl->transform_negotiate;
#endif
    ssl->session_in = ssl->session_negotiate;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
#if defined(MBEDTLS_SSL_DTLS_ANTI_REPLAY)
        mbedtls_ssl_dtls_replay_reset(ssl);
#endif

        /* Increment epoch */
        if (++ssl->in_epoch == 0) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("DTLS epoch would wrap"));
            /* This is highly unlikely to happen for legitimate reasons, so
               treat it as an attack and don't send an alert. */
            return MBEDTLS_ERR_SSL_COUNTER_WRAPPING;
        }
    } else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    memset(ssl->in_ctr, 0, MBEDTLS_SSL_SEQUENCE_NUMBER_LEN);

    mbedtls_ssl_update_in_pointers(ssl);

    ssl->state++;

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= parse change cipher spec"));

    return 0;
}